

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O3

void __thiscall WorkerThread::~WorkerThread(WorkerThread *this)

{
  LOCK();
  (this->stopMe)._M_base._M_i = true;
  UNLOCK();
  std::condition_variable::notify_all();
  if ((this->workerThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&this->taskCV);
  std::packaged_task<void_()>::~packaged_task(&this->task);
  if ((this->workerThread)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

WorkerThread::~WorkerThread () {
	stopWorker ();

	if (workerThread.joinable ())
		workerThread.join ();
}